

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O0

void gimage::reduceGauss<unsigned_char,unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *target,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  int iVar1;
  work_t wVar2;
  long lVar3;
  long lVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  work_t wVar5;
  long j_3;
  long j_2;
  float *p_1;
  float pv_1;
  long k_1;
  uchar *tp;
  long i_1;
  long j_1;
  long j;
  uchar *p;
  float pv;
  long i;
  long k;
  float *tmpp;
  int d;
  ImageFloat tmp;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  float fVar6;
  undefined4 in_stack_fffffffffffffe74;
  long in_stack_fffffffffffffe78;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffe80;
  long in_stack_fffffffffffffe98;
  long in_stack_fffffffffffffea0;
  long in_stack_fffffffffffffea8;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  long in_stack_fffffffffffffec0;
  long in_stack_fffffffffffffec8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffed0;
  long local_c8;
  long local_c0;
  Image<float,_gimage::PixelTraits<float>_> *local_b8;
  float local_ac;
  long local_a8;
  uchar *local_a0;
  long local_98;
  long local_90;
  long local_88;
  byte *local_80;
  float local_74;
  long local_70;
  long local_68;
  float *local_60;
  int local_58;
  Image<float,_gimage::PixelTraits<float>_> local_48;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
  Image<float,_gimage::PixelTraits<float>_>::Image
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  for (local_58 = 0;
      iVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      local_58 < iVar1; local_58 = local_58 + 1) {
    local_60 = Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_48,0,0,0);
    for (local_68 = 0;
        lVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
        local_68 < lVar3; local_68 = local_68 + 1) {
      local_70 = 0;
      while (lVar3 = local_70,
            lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
            lVar3 < lVar4) {
        local_74 = 0.0;
        if ((local_70 < 2) ||
           (lVar3 = local_70,
           lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
           lVar4 + -2 <= lVar3)) {
          for (local_90 = 0; local_90 < 5; local_90 = local_90 + 1) {
            fVar6 = reduceGauss<unsigned_char,_unsigned_char>::g[local_90];
            wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea0,
                               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
            local_74 = fVar6 * (float)wVar2 + local_74;
          }
        }
        else {
          local_80 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getPtr
                               (local_10,local_70 + -2,local_68,local_58);
          for (local_88 = 0; local_88 < 5; local_88 = local_88 + 1) {
            local_74 = reduceGauss<unsigned_char,_unsigned_char>::g[local_88] * (float)*local_80 +
                       local_74;
            local_80 = local_80 + 1;
          }
        }
        *local_60 = local_74;
        local_70 = local_70 + 2;
        local_60 = local_60 + 1;
      }
    }
    local_98 = 0;
    while (in_stack_fffffffffffffea8 = local_98,
          in_stack_fffffffffffffeb0 =
               (Image<float,_gimage::PixelTraits<float>_> *)
               Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_48),
          in_stack_fffffffffffffea8 < (long)in_stack_fffffffffffffeb0) {
      local_a0 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getPtr
                           (local_8,local_98,0,local_58);
      local_a8 = 0;
      while (in_stack_fffffffffffffe98 = local_a8,
            in_stack_fffffffffffffea0 =
                 Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_48),
            in_stack_fffffffffffffe98 < in_stack_fffffffffffffea0) {
        local_ac = 0.0;
        if ((local_a8 < 2) ||
           (lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_48),
           lVar3 + -2 <= local_a8)) {
          for (local_c8 = 0; local_c8 < 5; local_c8 = local_c8 + 1) {
            fVar6 = reduceGauss<unsigned_char,_unsigned_char>::g[local_c8];
            wVar5 = Image<float,_gimage::PixelTraits<float>_>::getBounds
                              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea0,
                               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
            local_ac = fVar6 * wVar5 + local_ac;
          }
        }
        else {
          in_stack_fffffffffffffe80 =
               (Image<float,_gimage::PixelTraits<float>_> *)
               Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_48,local_98,local_a8 + -2,0)
          ;
          local_b8 = in_stack_fffffffffffffe80;
          for (local_c0 = 0; local_c0 < 5; local_c0 = local_c0 + 1) {
            local_ac = reduceGauss<unsigned_char,_unsigned_char>::g[local_c0] *
                       (float)local_b8->depth + local_ac;
            lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_48);
            local_b8 = (Image<float,_gimage::PixelTraits<float>_> *)(&local_b8->depth + lVar3);
          }
        }
        *local_a0 = (uchar)(int)local_ac;
        lVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8);
        local_a0 = local_a0 + lVar3;
        local_a8 = local_a8 + 2;
      }
      local_98 = local_98 + 1;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(in_stack_fffffffffffffe80);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}